

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int64_t b;
  secp256k1_modinv64_modinfo *b_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int64_t sign;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong a;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t c1;
  long local_1b0;
  ulong local_1a8;
  long local_1a0;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  int64_t local_140;
  secp256k1_modinv64_modinfo *local_138;
  ulong local_130;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_58;
  
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[4] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  sign = (modinfo->modulus).v[4];
  f.v[0] = (modinfo->modulus).v[0];
  local_148 = (modinfo->modulus).v[1];
  local_150 = (modinfo->modulus).v[2];
  local_158 = (modinfo->modulus).v[3];
  uVar14 = x->v[0];
  local_160 = x->v[1];
  g.v[2] = x->v[2];
  local_168 = x->v[3];
  local_140 = x->v[4];
  uVar13 = 0xffffffffffffffff;
  uVar10 = f.v[0];
  local_170 = g.v[2];
  local_138 = modinfo;
  f.v[1] = local_148;
  f.v[2] = local_150;
  f.v[3] = local_158;
  f.v[4] = sign;
  g.v[0] = uVar14;
  g.v[1] = local_160;
  g.v[3] = local_168;
  g.v[4] = local_140;
  for (iVar2 = 0; iVar2 != 10; iVar2 = iVar2 + 1) {
    uVar11 = 8;
    a = 0;
    uVar9 = 0;
    uVar3 = uVar10;
    uVar6 = uVar14;
    uVar15 = uVar11;
    for (lVar4 = 3; lVar4 != 0x3e; lVar4 = lVar4 + 1) {
      if ((uVar3 & 1) == 0) {
        pcVar8 = "test condition failed: (f & 1) == 1";
        uVar5 = 0xb5;
        goto LAB_0012e98d;
      }
      if (uVar9 * uVar14 + uVar15 * uVar10 != uVar3 << ((byte)lVar4 & 0x3f)) {
        pcVar8 = "test condition failed: (u * f0 + v * g0) == f << i";
        uVar5 = 0xb6;
        goto LAB_0012e98d;
      }
      if (uVar11 * uVar14 + a * uVar10 != uVar6 << ((byte)lVar4 & 0x3f)) {
        pcVar8 = "test condition failed: (q * f0 + r * g0) == g << i";
        uVar5 = 0xb7;
        goto LAB_0012e98d;
      }
      c1 = (long)uVar13 >> 0x3f;
      local_1a8 = (ulong)((uint)uVar6 & 1);
      uVar12 = -local_1a8;
      uVar7 = c1 & uVar12;
      if ((uVar13 ^ uVar7) - 0x251 < 0xfffffffffffffb61) {
        pcVar8 = "test condition failed: zeta >= -591 && zeta <= 591";
        uVar5 = 0xd2;
        goto LAB_0012e98d;
      }
      uVar13 = (uVar13 ^ uVar7) - 1;
      uVar11 = uVar11 + ((c1 ^ uVar9) - c1 & uVar12);
      uVar9 = ((uVar11 & uVar7) + uVar9) * 2;
      a = a + ((c1 ^ uVar15) - c1 & uVar12);
      uVar15 = ((a & uVar7) + uVar15) * 2;
      uVar12 = ((c1 ^ uVar3) - c1 & uVar12) + uVar6;
      uVar6 = uVar12 >> 1;
      uVar3 = uVar3 + (uVar12 & uVar7);
    }
    local_190 = uVar9;
    local_188 = uVar15;
    local_180 = uVar10;
    t.u = uVar15;
    t.v = uVar9;
    t.q = a;
    t.r = uVar11;
    iVar1 = secp256k1_modinv64_det_check_pow2(&t,0x41,0);
    b_00 = local_138;
    if (iVar1 == 0) {
      pcVar8 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 65, 0)";
      uVar5 = 0xe0;
      goto LAB_0012e98d;
    }
    local_178 = uVar11;
    secp256k1_modinv64_update_de_62(&d,&local_58,&t,local_138);
    iVar1 = secp256k1_modinv64_mul_cmp_62(&f,5,&b_00->modulus,-1);
    if (iVar1 < 1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x25d;
      goto LAB_0012e98d;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62(&f,5,&b_00->modulus,1);
    if (0 < iVar1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0";
      uVar5 = 0x25e;
      goto LAB_0012e98d;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62(&g,5,&b_00->modulus,-1);
    if (iVar1 < 1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x25f;
      goto LAB_0012e98d;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62(&g,5,&b_00->modulus,1);
    uVar10 = local_180;
    if (-1 < iVar1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0";
      uVar5 = 0x260;
      goto LAB_0012e98d;
    }
    c1 = local_188 * local_180;
    local_1b0 = SUB168(SEXT816((long)local_188) * SEXT816((long)local_180),8);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_190,uVar14);
    uVar11 = local_178;
    local_1a8 = a * uVar10;
    local_1a0 = SUB168(SEXT816((long)a) * SEXT816((long)uVar10),8);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,local_178,uVar14);
    uVar14 = local_148;
    if ((c1 & 0x3fffffffffffffff) != 0) {
      pcVar8 = "test condition failed: (secp256k1_i128_to_u64(&cf) & M62) == 0";
      uVar5 = 0x200;
      goto LAB_0012e98d;
    }
    c1 = c1 >> 0x3e | local_1b0 << 2;
    local_1b0 = local_1b0 >> 0x3e;
    if ((local_1a8 & 0x3fffffffffffffff) != 0) {
      pcVar8 = "test condition failed: (secp256k1_i128_to_u64(&cg) & M62) == 0";
      uVar5 = 0x201;
      goto LAB_0012e98d;
    }
    local_1a8 = local_1a8 >> 0x3e | local_1a0 << 2;
    local_1a0 = local_1a0 >> 0x3e;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_188,local_148);
    uVar10 = local_160;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_190,local_160);
    local_130 = a;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,a,uVar14);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,uVar11,uVar10);
    uVar3 = local_150;
    uVar15 = local_188;
    uVar10 = local_1b0 << 2;
    local_180 = c1 & 0x3fffffffffffffff;
    local_1b0 = local_1b0 >> 0x3e;
    uVar11 = local_1a0 << 2;
    uVar14 = local_1a8 & 0x3fffffffffffffff;
    local_1a0 = local_1a0 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    local_1a8 = uVar11 | local_1a8 >> 0x3e;
    f.v[0] = local_180;
    g.v[0] = uVar14;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_188,local_150);
    uVar10 = local_170;
    uVar9 = local_190;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_190,local_170);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,local_130,uVar3);
    uVar3 = local_178;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,local_178,uVar10);
    uVar6 = local_158;
    uVar10 = local_1b0 << 2;
    local_148 = c1 & 0x3fffffffffffffff;
    local_1b0 = local_1b0 >> 0x3e;
    uVar11 = local_1a0 << 2;
    local_160 = local_1a8 & 0x3fffffffffffffff;
    local_1a0 = local_1a0 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    local_1a8 = uVar11 | local_1a8 >> 0x3e;
    f.v[1] = local_148;
    g.v[1] = local_160;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,uVar15,local_158);
    uVar10 = local_168;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,uVar9,local_168);
    uVar9 = local_130;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,local_130,uVar6);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,uVar3,uVar10);
    uVar10 = local_1b0 << 2;
    local_150 = c1 & 0x3fffffffffffffff;
    local_1b0 = local_1b0 >> 0x3e;
    uVar11 = local_1a0 << 2;
    uVar15 = local_1a8 & 0x3fffffffffffffff;
    local_1a0 = local_1a0 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    local_1a8 = uVar11 | local_1a8 >> 0x3e;
    f.v[2] = local_150;
    g.v[2] = uVar15;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_188,sign);
    b = local_140;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,local_190,local_140);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,uVar9,sign);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1a8,local_178,b);
    uVar10 = local_1b0 << 2;
    local_158 = c1 & 0x3fffffffffffffff;
    local_1b0 = local_1b0 >> 0x3e;
    uVar11 = local_1a0 << 2;
    local_168 = local_1a8 & 0x3fffffffffffffff;
    local_1a0 = local_1a0 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    local_1a8 = uVar11 | local_1a8 >> 0x3e;
    f.v[3] = local_158;
    g.v[3] = local_168;
    sign = secp256k1_i128_to_i64((secp256k1_int128 *)&c1);
    f.v[4] = sign;
    local_140 = secp256k1_i128_to_i64((secp256k1_int128 *)&local_1a8);
    modinfo = local_138;
    g.v[4] = local_140;
    iVar1 = secp256k1_modinv64_mul_cmp_62(&f,5,&local_138->modulus,-1);
    if (iVar1 < 1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x264;
      goto LAB_0012e98d;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62(&f,5,&modinfo->modulus,1);
    if (0 < iVar1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0";
      uVar5 = 0x265;
      goto LAB_0012e98d;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62(&g,5,&modinfo->modulus,-1);
    if (iVar1 < 1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x266;
      goto LAB_0012e98d;
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62(&g,5,&modinfo->modulus,1);
    if (-1 < iVar1) {
      pcVar8 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0";
      uVar5 = 0x267;
      goto LAB_0012e98d;
    }
    uVar10 = local_180;
    local_170 = uVar15;
  }
  iVar2 = secp256k1_modinv64_mul_cmp_62(&g,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&SECP256K1_SIGNED62_ONE,-1);
    if (iVar2 != 0) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar2 != 0) {
        iVar2 = secp256k1_modinv64_mul_cmp_62(x,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar2 == 0) {
          iVar2 = secp256k1_modinv64_mul_cmp_62(&d,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar2 == 0) {
            iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&modinfo->modulus,1);
            if (iVar2 == 0) goto LAB_0012e8b7;
          }
        }
        pcVar8 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 || (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0)"
        ;
        uVar5 = 0x275;
        goto LAB_0012e98d;
      }
    }
LAB_0012e8b7:
    secp256k1_modinv64_normalize_62(&d,sign,modinfo);
    x->v[4] = d.v[4];
    x->v[2] = d.v[2];
    x->v[3] = d.v[3];
    x->v[0] = d.v[0];
    x->v[1] = d.v[1];
    return;
  }
  pcVar8 = 
  "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0";
  uVar5 = 0x26f;
LAB_0012e98d:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,uVar5,pcVar8);
  abort();
}

Assistant:

static void secp256k1_modinv64(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int i;
    int64_t zeta = -1; /* zeta = -(delta+1/2); delta starts at 1/2. */

    /* Do 10 iterations of 59 divsteps each = 590 divsteps. This suffices for 256-bit inputs. */
    for (i = 0; i < 10; ++i) {
        /* Compute transition matrix and new zeta after 59 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        zeta = secp256k1_modinv64_divsteps_59(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[4], modinfo);
    *x = d;
}